

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSetupColumnFlags
               (ImGuiTable *table,ImGuiTableColumn *column,ImGuiTableColumnFlags flags_in)

{
  ImGuiTableColumn *pIVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  
  uVar3 = flags_in & 0xc;
  if (uVar3 == 0) {
    uVar3 = table->Flags & 0xe000;
    if ((uVar3 == 0x4000) || (uVar3 == 0x2000)) {
      flags_in = flags_in | 8;
    }
    else {
      flags_in = flags_in | 4;
    }
  }
  else if ((uVar3 & uVar3 - 1) != 0) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0x27c,
                  "void TableSetupColumnFlags(ImGuiTable *, ImGuiTableColumn *, ImGuiTableColumnFlags)"
                 );
  }
  uVar4 = (~table->Flags & 1U) << 4 | flags_in;
  uVar3 = uVar4 | 0x100;
  if ((~flags_in & 0x600U) != 0) {
    uVar3 = uVar4;
  }
  if ((uVar3 & 0xc000) == 0) {
    pIVar1 = (table->Columns).Data;
    if ((column < pIVar1) || ((table->Columns).DataEnd <= column)) {
      __assert_fail("it >= Data && it < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                    ,0x21f,
                    "int ImSpan<ImGuiTableColumn>::index_from_ptr(const T *) const [T = ImGuiTableColumn]"
                   );
    }
    uVar3 = uVar3 + (uint)((int)((ulong)((long)column - (long)pIVar1) >> 3) * -0x3b13b13b != 0) *
                    0x4000 + 0x4000;
  }
  column->Flags = column->Flags & 0xf00000U | uVar3;
  column->SortDirectionsAvailList = '\0';
  bVar2 = column->field_0x64 & 3;
  column->field_0x64 = bVar2;
  if ((table->Flags & 8U) != 0) {
    bVar8 = (uVar3 & 0x1200) == 0x1000;
    bVar5 = 2;
    if (bVar8) {
      bVar5 = 8;
    }
    bVar9 = (uVar3 & 0x2400) != 0x2000;
    uVar4 = bVar8 + 1;
    bVar6 = bVar8 * '\x02' + 4;
    if (bVar9) {
      uVar4 = (uint)bVar8;
      bVar6 = bVar8 * '\x02';
    }
    bVar7 = 0;
    if (!bVar9) {
      bVar7 = bVar5;
    }
    bVar7 = bVar7 | bVar8;
    if ((uVar3 & 0x1200) == 0) {
      bVar6 = bVar6 | 2;
      bVar7 = bVar7 | (byte)(1 << uVar4 * 2);
      uVar4 = uVar4 + 1;
    }
    if ((uVar3 & 0x2400) == 0) {
      bVar6 = bVar6 | 4;
      bVar7 = bVar7 | (byte)(2 << (char)uVar4 * '\x02');
      uVar4 = uVar4 + 1;
    }
    bVar5 = uVar4 == 0 | (byte)((uint)table->Flags >> 0x1b) & 1;
    column->SortDirectionsAvailList = bVar7;
    column->field_0x64 = ((char)uVar4 + bVar5) * '\x04' & 0xc | (bVar6 | bVar5) << 4 | bVar2;
    ImGui::TableFixColumnSortDirection(table,column);
    return;
  }
  return;
}

Assistant:

static void TableSetupColumnFlags(ImGuiTable* table, ImGuiTableColumn* column, ImGuiTableColumnFlags flags_in)
{
    ImGuiTableColumnFlags flags = flags_in;

    // Sizing Policy
    if ((flags & ImGuiTableColumnFlags_WidthMask_) == 0)
    {
        const ImGuiTableFlags table_sizing_policy = (table->Flags & ImGuiTableFlags_SizingMask_);
        if (table_sizing_policy == ImGuiTableFlags_SizingFixedFit || table_sizing_policy == ImGuiTableFlags_SizingFixedSame)
            flags |= ImGuiTableColumnFlags_WidthFixed;
        else
            flags |= ImGuiTableColumnFlags_WidthStretch;
    }
    else
    {
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_WidthMask_)); // Check that only 1 of each set is used.
    }
    
    // Resize
    if ((table->Flags & ImGuiTableFlags_Resizable) == 0)
        flags |= ImGuiTableColumnFlags_NoResize;

    // Sorting
    if ((flags & ImGuiTableColumnFlags_NoSortAscending) && (flags & ImGuiTableColumnFlags_NoSortDescending))
        flags |= ImGuiTableColumnFlags_NoSort;

    // Indentation
    if ((flags & ImGuiTableColumnFlags_IndentMask_) == 0)
        flags |= (table->Columns.index_from_ptr(column) == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

    // Alignment
    //if ((flags & ImGuiTableColumnFlags_AlignMask_) == 0)
    //    flags |= ImGuiTableColumnFlags_AlignCenter;
    //IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiTableColumnFlags_AlignMask_)); // Check that only 1 of each set is used.

    // Preserve status flags
    column->Flags = flags | (column->Flags & ImGuiTableColumnFlags_StatusMask_);

    // Build an ordered list of available sort directions
    column->SortDirectionsAvailCount = column->SortDirectionsAvailMask = column->SortDirectionsAvailList = 0;
    if (table->Flags & ImGuiTableFlags_Sortable)
    {
        int count = 0, mask = 0, list = 0;
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  != 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) != 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortAscending)  == 0 && (flags & ImGuiTableColumnFlags_NoSortAscending)  == 0) { mask |= 1 << ImGuiSortDirection_Ascending;  list |= ImGuiSortDirection_Ascending  << (count << 1); count++; }
        if ((flags & ImGuiTableColumnFlags_PreferSortDescending) == 0 && (flags & ImGuiTableColumnFlags_NoSortDescending) == 0) { mask |= 1 << ImGuiSortDirection_Descending; list |= ImGuiSortDirection_Descending << (count << 1); count++; }
        if ((table->Flags & ImGuiTableFlags_SortTristate) || count == 0) { mask |= 1 << ImGuiSortDirection_None; count++; }
        column->SortDirectionsAvailList = (ImU8)list;
        column->SortDirectionsAvailMask = (ImU8)mask;
        column->SortDirectionsAvailCount = (ImU8)count;
        ImGui::TableFixColumnSortDirection(table, column);
    }
}